

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O1

void __thiscall HuffmanArchiver::zip(HuffmanArchiver *this,istream *cin,ostream *cout)

{
  uint uVar1;
  ulong *puVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  long *plVar6;
  mapped_type *pmVar7;
  ulong in_RCX;
  long lVar8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  __node_base _Var12;
  int iVar13;
  ulong uVar14;
  ulong *puVar15;
  BitWriter out;
  char c;
  HuffTree h_tree;
  unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  alphabet;
  _Bit_pointer local_110;
  BitWriter local_f0;
  vector<bool,_std::allocator<bool>_> local_e0;
  undefined1 local_b8 [32];
  _Bit_pointer local_98;
  istream *local_80;
  HuffTree local_78;
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_80 = cin;
  count_data(this,cin);
  HuffTree::HuffTree(&local_78,&this->_data);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  HuffTree::get_alphabet
            ((unordered_map<char,_std::vector<bool,_std::allocator<bool>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>_>
              *)local_b8,&local_78);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&local_68,local_b8);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_b8);
  iVar5 = HuffTree::get_full_code_size(&local_78);
  BitWriter::BitWriter(&local_f0,cout);
  BitWriter::write(&local_f0,(int)this->num_of_symbols_in,(void *)0x40,in_RCX);
  BitWriter::write(&local_f0,iVar5,(void *)0x20,in_RCX);
  BitWriter::write(&local_f0,(int)local_68._M_element_count,(void *)0x10,in_RCX);
  if (local_68._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
    local_110 = (_Bit_pointer)0x0;
  }
  else {
    local_110 = (_Bit_pointer)0x0;
    p_Var10 = (_Hash_node_base *)0x0;
    _Var12._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      BitWriter::write(&local_f0,(int)*(char *)&_Var12._M_nxt[1]._M_nxt,(void *)0x8,in_RCX);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_e0,(vector<bool,_std::allocator<bool>_> *)(_Var12._M_nxt + 2));
      get_full_code((vector<bool,_std::allocator<bool>_> *)local_b8,&local_e0,iVar5);
      if (p_Var10 != (_Hash_node_base *)0x0) {
        operator_delete(p_Var10,(long)local_110 - (long)p_Var10);
      }
      uVar4 = local_b8._24_4_;
      uVar3 = local_b8._16_8_;
      p_Var10 = (_Hash_node_base *)local_b8._0_8_;
      local_110 = local_98;
      local_b8._0_8_ = (_Hash_node_base *)0x0;
      local_b8._8_4_ = 0;
      local_b8._16_8_ = (_Hash_node_base *)0x0;
      local_b8._24_4_ = 0;
      local_98 = (_Bit_pointer)0x0;
      if (local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      in_RCX = CONCAT71((int7)(in_RCX >> 8),uVar4 != 0 || p_Var10 != (_Hash_node_base *)uVar3);
      if (uVar4 != 0 || p_Var10 != (_Hash_node_base *)uVar3) {
        p_Var11 = p_Var10;
        uVar9 = 0;
        do {
          BitWriter::write(&local_f0,(uint)(((ulong)p_Var11->_M_nxt >> (uVar9 & 0x3f) & 1) != 0),
                           (void *)0x1,in_RCX);
          iVar13 = (int)uVar9;
          p_Var11 = p_Var11 + (iVar13 == 0x3f);
          in_RCX = (ulong)(iVar13 + 1);
          if (iVar13 == 0x3f) {
            in_RCX = 0;
          }
          uVar9 = in_RCX;
        } while ((uint)in_RCX != uVar4 || p_Var11 != (_Hash_node_base *)uVar3);
      }
      _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
    } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
  }
  this->used_additional_bytes = (long)(iVar5 + 8) * local_68._M_element_count + 0x70 >> 3;
  while( true ) {
    plVar6 = (long *)std::istream::read((char *)local_80,(long)local_b8);
    lVar8 = *(long *)(*plVar6 + -0x18);
    if ((*(byte *)((long)plVar6 + lVar8 + 0x20) & 5) != 0) break;
    pmVar7 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,local_b8);
    puVar15 = (pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    puVar2 = (pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    uVar1 = (pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    uVar9 = CONCAT71((int7)((ulong)lVar8 >> 8),uVar1 != 0 || puVar15 != puVar2);
    if (uVar1 != 0 || puVar15 != puVar2) {
      uVar14 = 0;
      do {
        BitWriter::write(&local_f0,(uint)((*puVar15 >> (uVar14 & 0x3f) & 1) != 0),(void *)0x1,uVar9)
        ;
        iVar5 = (int)uVar14;
        uVar9 = (ulong)(iVar5 + 1);
        if (iVar5 == 0x3f) {
          uVar9 = 0;
        }
        puVar15 = puVar15 + (iVar5 == 0x3f);
        uVar14 = uVar9;
      } while ((uint)uVar9 != uVar1 || puVar15 != puVar2);
    }
    pmVar7 = std::__detail::
             _Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,local_b8);
    this->num_of_symbols_out =
         (ulong)(pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         this->num_of_symbols_out +
         ((long)(pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(pmVar7->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p) * 8;
  }
  this->num_of_symbols_out = this->num_of_symbols_out + 7 >> 3;
  BitWriter::~BitWriter(&local_f0);
  std::
  _Hashtable<char,_std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_char,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (p_Var10 != (_Hash_node_base *)0x0) {
    operator_delete(p_Var10,(long)local_110 - (long)p_Var10);
  }
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (&local_78.root);
  return;
}

Assistant:

void HuffmanArchiver::zip(std::istream &cin, std::ostream &cout) {
    count_data(cin);
    HuffTree h_tree(_data);
    std::vector<bool> full_code;

    std::unordered_map<char, std::vector<bool>> alphabet;
    alphabet = h_tree.get_alphabet();
    int full_code_size = h_tree.get_full_code_size();

    BitWriter out(cout);

    out.write(static_cast<int>(num_of_symbols_in), BITS_IN_SIZE_T);
    out.write(full_code_size, BITS_IN_INT);
    out.write(static_cast<int>(alphabet.size()), ALPHABET_SIZE);
    for (const auto &i : alphabet) {
        out.write(i.first, BITS_IN_BYTE);
        full_code = get_full_code(i.second, full_code_size);
        for (bool bit : full_code) {
            out.write(bit, 1);
        }
    }

    used_additional_bytes = BITS_IN_SIZE_T + ALPHABET_SIZE + alphabet.size() * (BITS_IN_BYTE + full_code_size)
                            + BITS_IN_INT;
    used_additional_bytes /= BITS_IN_BYTE;

    char c;
    while (cin.read(&c, 1)) {
        for (bool bit : alphabet[c]) {
            out.write(bit, 1);
        }
        num_of_symbols_out += alphabet[c].size();
    }
    num_of_symbols_out = (num_of_symbols_out + 7) / 8;
}